

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch_io.hpp
# Opt level: O1

Cell * __thiscall
notch::io::CSVReader::parseCell(Cell *__return_storage_ptr__,CSVReader *this,string *s)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  char *__nptr;
  pointer pcVar2;
  float fVar3;
  char *parseEnd;
  char *local_28;
  
  __nptr = (s->_M_dataplus)._M_p;
  local_28 = (char *)0x0;
  fVar3 = strtof(__nptr,&local_28);
  paVar1 = &(__return_storage_ptr__->str).field_2;
  if (local_28 == __nptr || local_28 == (char *)0x0) {
    __return_storage_ptr__->tag = String;
    __return_storage_ptr__->value = 0.0;
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)paVar1;
    pcVar2 = (s->_M_dataplus)._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->str,pcVar2,pcVar2 + s->_M_string_length);
  }
  else {
    __return_storage_ptr__->tag = Number;
    __return_storage_ptr__->value = fVar3;
    (__return_storage_ptr__->str)._M_dataplus._M_p = (pointer)paVar1;
    std::__cxx11::string::_M_construct<char_const*>((string *)&__return_storage_ptr__->str,"");
  }
  return __return_storage_ptr__;
}

Assistant:

Cell parseCell(const std::string &s) {
        // float value = std::stof(s); // doesn't work on MinGW-32; BUG #52015
        const char *parseBegin = s.c_str();
        char *parseEnd = nullptr;
        float value = strtof(parseBegin, &parseEnd);
        if (parseEnd == parseBegin || parseEnd == nullptr) {
            return Cell { CellTag::String, 0.0, s };
        } else {
            return Cell { CellTag::Number, value, "" };
        }
    }